

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O2

void __thiscall
oout::ContainTest::ContainTest<char_const*>(ContainTest *this,string *text,char *subs)

{
  allocator<char> local_69;
  undefined1 local_68 [40];
  string local_40;
  
  std::make_shared<oout::StringText,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  local_68._16_8_ = local_68._0_8_;
  local_68._24_8_ = local_68._8_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,subs,&local_69);
  ContainTest<>(this,(shared_ptr<const_oout::Text> *)(local_68 + 0x10),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  return;
}

Assistant:

ContainTest(
		const std::string &text,
		S ... subs
	) : ContainTest(std::make_shared<StringText>(text), subs...)
	{
	}